

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall fmp4_stream::full_box::print(full_box *this)

{
  long lVar1;
  ostream *poVar2;
  char local_29;
  
  box::print(&this->super_box);
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"version: ",9);
  local_29 = (this->super_box).field_0x62;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"flags: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void full_box::print() const
	{
		box::print();
		std::cout << std::setw(33) << std::left << "version: " << this->version_ << std::endl;
		std::cout << std::setw(33) << std::left << "flags: " << flags_ << std::endl;
	}